

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workerThread.cpp
# Opt level: O0

void __thiscall WorkerThread::WorkerThread(WorkerThread *this)

{
  thread *in_RDI;
  thread *__t;
  thread *this_00;
  thread *in_stack_fffffffffffffff0;
  
  __t = in_RDI;
  std::thread::thread((thread *)0x119a7f);
  this_00 = in_RDI + 1;
  std::packaged_task<void_()>::packaged_task((packaged_task<void_()> *)0x119a92);
  std::mutex::mutex((mutex *)0x119aa0);
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 9));
  std::atomic<bool>::operator=((atomic<bool> *)this_00,SUB81((ulong)__t >> 0x38,0));
  *(undefined1 *)&in_RDI[3]._M_id._M_thread = 0;
  std::thread::thread<WorkerThread::WorkerThread()::__0,,void>
            (in_stack_fffffffffffffff0,(type *)in_RDI);
  std::thread::operator=(this_00,__t);
  std::thread::~thread((thread *)0x119afa);
  return;
}

Assistant:

WorkerThread::WorkerThread () {
	stopMe			= false;
	taskPresence	= false;
	workerThread	= std::thread ([&] {
		workerFunction ();
	});
}